

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::attachClause(Solver *this,CRef cr)

{
  uint64_t *puVar1;
  long *plVar2;
  uint *puVar3;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *pOVar4;
  Watcher local_38;
  
  puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
  puVar1 = &(this->statistics).solveSteps;
  *puVar1 = *puVar1 + 1;
  pOVar4 = &this->watches;
  if ((uint)((ulong)*(undefined8 *)(puVar3 + cr) >> 0x22) == 2) {
    pOVar4 = &this->watches_bin;
  }
  local_38.blocker.x = puVar3[(ulong)cr + 3];
  local_38.cref = cr;
  vec<Minisat::Watcher>::push
            ((pOVar4->occs).data + ((long)(int)puVar3[(ulong)cr + 2] ^ 1),&local_38);
  local_38.blocker.x = puVar3[(ulong)cr + 2];
  vec<Minisat::Watcher>::push
            ((pOVar4->occs).data + ((long)(int)puVar3[(ulong)cr + 3] ^ 1),&local_38);
  plVar2 = (long *)((long)&this->clauses_literals + (ulong)((uint)*(ulong *)(puVar3 + cr) & 4) * 2);
  *plVar2 = *plVar2 + (*(ulong *)(puVar3 + cr) >> 0x22);
  return;
}

Assistant:

void Solver::attachClause(CRef cr)
{
    const Clause &c = ca[cr];
    statistics.solveSteps++;
    assert(c.size() > 1);
    OccLists<Lit, vec<Watcher>, WatcherDeleted> &ws = c.size() == 2 ? watches_bin : watches;
    ws[~c[0]].push(Watcher(cr, c[1]));
    ws[~c[1]].push(Watcher(cr, c[0]));
    if (c.learnt())
        learnts_literals += c.size();
    else
        clauses_literals += c.size();
}